

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O2

void Abc_GraphSolve(Gia_Man_t *pGia)

{
  uint __exponent;
  int *pLits;
  int iVar1;
  int iVar2;
  Cnf_Dat_t *p;
  Vec_Int_t *p_00;
  sat_solver *s;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  word local_58;
  
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  p_00 = Vec_IntAlloc(100);
  __exponent = pGia->vCis->nSize;
  iVar6 = p->nVars - __exponent;
  s = sat_solver_new();
  sat_solver_setnvars(s,p->nVars);
  lVar5 = 0;
  while (lVar5 < p->nClauses) {
    iVar1 = sat_solver_addclause(s,p->pClauses[lVar5],p->pClauses[lVar5 + 1]);
    lVar5 = lVar5 + 1;
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPath.c"
                    ,0x231,"void Abc_GraphSolve(Gia_Man_t *)");
    }
  }
  p_00->nSize = 0;
  uVar7 = 0;
  if (0 < (int)__exponent) {
    uVar7 = (ulong)__exponent;
  }
  while ((int)uVar7 != 0) {
    iVar1 = Abc_Var2Lit(iVar6,1);
    Vec_IntPush(p_00,iVar1);
    iVar6 = iVar6 + 1;
    uVar7 = (ulong)((int)uVar7 - 1);
  }
  local_58 = 0;
  uVar7 = 0;
  for (iVar6 = 0; iVar6 != 1000; iVar6 = iVar6 + 1) {
    pLits = p_00->pArray;
    uVar8 = p_00->nSize;
    iVar1 = sat_solver_solve_lexsat(s,pLits,uVar8);
    if (iVar1 != 1) break;
    uVar9 = 0;
    uVar3 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar3 = uVar9;
    }
    while( true ) {
      iVar1 = (int)uVar9;
      if ((int)uVar3 == iVar1) break;
      iVar2 = Vec_IntEntry(p_00,iVar1);
      iVar2 = Abc_LitNot(iVar2);
      Vec_IntWriteEntry(p_00,iVar1,iVar2);
      uVar9 = (ulong)(iVar1 + 1);
    }
    iVar1 = sat_solver_addclause(s,pLits,pLits + (int)uVar8);
    if (iVar1 == 0) break;
    for (iVar1 = 0; (int)uVar3 != iVar1; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(p_00,iVar1);
      iVar2 = Abc_LitNot(iVar2);
      Vec_IntWriteEntry(p_00,iVar1,iVar2);
    }
    uVar7 = 0;
    uVar8 = __exponent;
    for (uVar9 = 0; uVar8 = uVar8 - 1, uVar3 != uVar9; uVar9 = uVar9 + 1) {
      iVar1 = Vec_IntEntry(p_00,(int)uVar9);
      iVar1 = Abc_LitIsCompl(iVar1);
      uVar4 = 1L << ((byte)uVar8 & 0x3f);
      if (iVar1 != 0) {
        uVar4 = 0;
      }
      uVar7 = uVar7 | uVar4;
    }
    if (local_58 == 0) {
      local_58 = uVar7;
    }
  }
  uVar3 = (uVar7 - local_58) / 1000;
  dVar10 = Abc_Word2Double(uVar7 - local_58);
  dVar11 = Abc_Word2Double(uVar3);
  printf("Vars = %d   Iters = %d   Ave = %.0f   Total = %.0f  ",dVar10,dVar11,(ulong)__exponent,1000
        );
  dVar10 = ldexp(1.0,__exponent);
  dVar11 = Abc_Word2Double(local_58);
  dVar12 = Abc_Word2Double(uVar3);
  printf("Estimate = %.0f\n",(dVar10 - dVar11) / dVar12);
  sat_solver_delete(s);
  Cnf_DataFree(p);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Abc_GraphSolve( Gia_Man_t * pGia )
{
    int nIters = 1000;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    sat_solver * pSat; Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    int i, k, iLit, nVars = Gia_ManCiNum(pGia);
    int iCiVarBeg = pCnf->nVars - nVars;
    word Total = 0;
    word Mint1 = 0;
    word Mint2 = 0;

    // restart the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );
    // create trivial assignment
    Vec_IntClear( vLits );
    for ( k = 0; k < nVars; k++ )
        Vec_IntPush( vLits, Abc_Var2Lit(iCiVarBeg+k, 1) );
    // generate random assignment
    for ( i = 0; i < nIters; i++ )
    {
        int Status = sat_solver_solve_lexsat( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) );
        if ( Status != l_True )
            break;
        assert( Status == l_True );
        // block this assignment
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) ) )
            break;
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        // collect new minterm
        Mint2 = 0;
        Vec_IntForEachEntry( vLits, iLit, k )
            if ( !Abc_LitIsCompl(iLit) )
                Mint2 |= ((word)1) << (nVars-1-k);
        if ( Mint1 == 0 )
            Mint1 = Mint2;
        // report
        //printf( "Iter %3d : ", i );
        //Extra_PrintBinary( stdout, (unsigned *)&Mint2, Abc_MinInt(64, nVars) ); printf( "\n" );
    }
    //Mint1 = 0;
    Total = (Mint2-Mint1)/nIters;
    printf( "Vars = %d   Iters = %d   Ave = %.0f   Total = %.0f  ", nVars, nIters, Abc_Word2Double(Mint2-Mint1), Abc_Word2Double(Total) );
    printf( "Estimate = %.0f\n", (pow(2,nVars)-Abc_Word2Double(Mint1))/Abc_Word2Double((Mint2-Mint1)/nIters) );

    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Vec_IntFree( vLits );
}